

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O0

MPP_RET mpp_packet_read(MppPacket packet,size_t offset,void *data,size_t size)

{
  MPP_RET MVar1;
  void *pvVar2;
  void *src;
  size_t size_local;
  void *data_local;
  size_t offset_local;
  MppPacket packet_local;
  
  MVar1 = check_is_mpp_packet_f(packet,"mpp_packet_read");
  if ((MVar1 == MPP_OK) && (data != (void *)0x0)) {
    if (size == 0) {
      packet_local._4_4_ = MPP_OK;
    }
    else {
      pvVar2 = mpp_packet_get_data(packet);
      if ((pvVar2 == (void *)0x0) &&
         (_mpp_log_l(2,"mpp_packet","Assertion %s failed at %s:%d\n",(char *)0x0,"src != __null",
                     "mpp_packet_read",0x188), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      memcpy(data,(void *)((long)pvVar2 + offset),size);
      packet_local._4_4_ = MPP_OK;
    }
  }
  else {
    _mpp_log_l(2,"mpp_packet","invalid input: packet %p data %p\n","mpp_packet_read",packet,data);
    packet_local._4_4_ = MPP_ERR_UNKNOW;
  }
  return packet_local._4_4_;
}

Assistant:

MPP_RET mpp_packet_read(MppPacket packet, size_t offset, void *data, size_t size)
{
    if (check_is_mpp_packet(packet) || NULL == data) {
        mpp_err_f("invalid input: packet %p data %p\n", packet, data);
        return MPP_ERR_UNKNOW;
    }

    if (0 == size)
        return MPP_OK;

    void *src = mpp_packet_get_data(packet);
    mpp_assert(src != NULL);
    memcpy(data, (char*)src + offset, size);
    return MPP_OK;
}